

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

void __thiscall
ON_3dmAnnotationSettings::SetWorldViewHatchScale
          (ON_3dmAnnotationSettings *this,double world_view_hatch_scale)

{
  bool bVar1;
  ON_3dmAnnotationSettingsPrivate *pOVar2;
  
  if (this != &Default) {
    bVar1 = ON_IsValid(world_view_hatch_scale);
    if (0.0 < world_view_hatch_scale && bVar1) {
      pOVar2 = &Default3dmAnnotationSettingsPrivate;
      if (this->m_private != (ON_3dmAnnotationSettingsPrivate *)0x0) {
        pOVar2 = this->m_private;
      }
      if (((double)pOVar2->m_world_view_hatch_scale != world_view_hatch_scale) ||
         (NAN((double)pOVar2->m_world_view_hatch_scale) || NAN(world_view_hatch_scale))) {
        if (this->m_private == (ON_3dmAnnotationSettingsPrivate *)0x0) {
          pOVar2 = (ON_3dmAnnotationSettingsPrivate *)operator_new(0x1c);
          pOVar2->m_world_view_text_scale = 0.0;
          pOVar2->m_world_view_hatch_scale = 0.0;
          pOVar2->m_use_dimension_layer = false;
          *(undefined3 *)&pOVar2->field_0x9 = 0;
          (pOVar2->m_dimension_layer_id).Data1 = 0;
          (pOVar2->m_dimension_layer_id).Data1 = 0;
          (pOVar2->m_dimension_layer_id).Data2 = 0;
          (pOVar2->m_dimension_layer_id).Data3 = 0;
          (pOVar2->m_dimension_layer_id).Data4[0] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[1] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[2] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[3] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[4] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[5] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[6] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[7] = '\0';
          pOVar2->m_world_view_text_scale = 1.0;
          pOVar2->m_world_view_hatch_scale = 1.0;
          pOVar2->m_use_dimension_layer = false;
          (pOVar2->m_dimension_layer_id).Data1 = 0;
          (pOVar2->m_dimension_layer_id).Data2 = 0;
          (pOVar2->m_dimension_layer_id).Data3 = 0;
          (pOVar2->m_dimension_layer_id).Data4[0] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[1] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[2] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[3] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[4] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[5] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[6] = '\0';
          (pOVar2->m_dimension_layer_id).Data4[7] = '\0';
          this->m_private = pOVar2;
        }
        this->m_private->m_world_view_hatch_scale = (float)world_view_hatch_scale;
      }
    }
  }
  return;
}

Assistant:

void ON_3dmAnnotationSettings::SetWorldViewHatchScale(double world_view_hatch_scale)
{
  if (this == &ON_3dmAnnotationSettings::Default)
    return;
  if (ON_IsValid(world_view_hatch_scale) && world_view_hatch_scale > 0.0)
  {
    if (WorldViewHatchScale() != world_view_hatch_scale)
    {
      if (nullptr == m_private)
        m_private = new ON_3dmAnnotationSettingsPrivate();
      m_private->m_world_view_hatch_scale = (float)world_view_hatch_scale;
    }
  }
}